

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

_Bool find_affine(Correspondence *points,int *indices,int num_indices,double *params)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dy;
  double dx;
  double sy;
  double sx;
  int index;
  int i;
  double b [2];
  double a [2] [3];
  double x [2] [3];
  double y [2] [3];
  double mat [2] [9];
  int n;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  double *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  double *in_stack_fffffffffffffe80;
  int local_16c;
  double local_158;
  undefined8 local_150;
  double *local_148;
  double local_140;
  undefined8 local_138;
  double *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  double local_f8 [3];
  double adStack_e0 [3];
  double local_c8 [9];
  double adStack_80 [10];
  undefined4 local_2c;
  undefined8 *local_28;
  int local_1c;
  long local_18;
  long local_10;
  _Bool local_1;
  
  local_2c = 3;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  least_squares_init(in_stack_fffffffffffffe70,
                     (double *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
  least_squares_init(in_stack_fffffffffffffe70,
                     (double *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0);
  for (local_16c = 0; local_16c < local_1c; local_16c = local_16c + 1) {
    iVar2 = *(int *)(local_18 + (long)local_16c * 4);
    uVar1 = *(undefined8 *)(local_10 + (long)iVar2 * 0x20);
    in_stack_fffffffffffffe80 = *(double **)(local_10 + (long)iVar2 * 0x20 + 8);
    in_stack_fffffffffffffe78 = *(double **)(local_10 + (long)iVar2 * 0x20 + 0x10);
    in_stack_fffffffffffffe70 = *(double **)(local_10 + (long)iVar2 * 0x20 + 0x18);
    local_158 = 1.0;
    local_150 = uVar1;
    local_148 = in_stack_fffffffffffffe80;
    least_squares_accumulate(local_c8,local_f8,&local_158,(double)in_stack_fffffffffffffe78,3);
    local_140 = 1.0;
    local_138 = uVar1;
    local_130 = in_stack_fffffffffffffe80;
    least_squares_accumulate(adStack_80,adStack_e0,&local_140,(double)in_stack_fffffffffffffe70,3);
  }
  iVar2 = least_squares_solve(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                              in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    iVar2 = least_squares_solve(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    if (iVar2 == 0) {
      local_1 = false;
    }
    else {
      *local_28 = local_128;
      local_28[1] = local_110;
      local_28[2] = local_120;
      local_28[3] = local_118;
      local_28[4] = local_108;
      local_28[5] = local_100;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool find_affine(const Correspondence *points, const int *indices,
                        int num_indices, double *params) {
  // Note: The least squares problem for affine models is 6-dimensional,
  // but it splits into two independent 3-dimensional subproblems.
  // Solving these two subproblems separately and recombining at the end
  // results in less total computation than solving the 6-dimensional
  // problem directly.
  //
  // The two subproblems correspond to all the parameters which contribute
  // to the x output of the model, and all the parameters which contribute
  // to the y output, respectively.

  const int n = 3;       // Size of each least-squares problem
  double mat[2][3 * 3];  // Accumulator for A'A
  double y[2][3];        // Accumulator for A'b
  double x[2][3];        // Output vector
  double a[2][3];        // Single row of A
  double b[2];           // Single element of b

  least_squares_init(mat[0], y[0], n);
  least_squares_init(mat[1], y[1], n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0][0] = 1;
    a[0][1] = sx;
    a[0][2] = sy;
    b[0] = dx;
    least_squares_accumulate(mat[0], y[0], a[0], b[0], n);

    a[1][0] = 1;
    a[1][1] = sx;
    a[1][2] = sy;
    b[1] = dy;
    least_squares_accumulate(mat[1], y[1], a[1], b[1], n);
  }

  if (!least_squares_solve(mat[0], y[0], x[0], n)) {
    return false;
  }
  if (!least_squares_solve(mat[1], y[1], x[1], n)) {
    return false;
  }

  // Rearrange least squares result to form output model
  params[0] = x[0][0];
  params[1] = x[1][0];
  params[2] = x[0][1];
  params[3] = x[0][2];
  params[4] = x[1][1];
  params[5] = x[1][2];

  return true;
}